

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmloutput.cpp
# Opt level: O3

void __thiscall XmlOutput::newTagOpen(XmlOutput *this,QString *tag)

{
  QTextStream *pQVar1;
  long in_FS_OFFSET;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (Tag < this->currentState) {
    QTextStream::operator<<(this->xmlFile,'>');
    this->currentState = Tag;
  }
  if (this->format == NewLine) {
    pQVar1 = (QTextStream *)Qt::endl(this->xmlFile);
    QTextStream::operator<<(pQVar1,(QString *)&this->currentIndent);
  }
  pQVar1 = (QTextStream *)QTextStream::operator<<(this->xmlFile,'<');
  doConversion(&local_40,this,tag);
  QTextStream::operator<<(pQVar1,(QString *)&local_40);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  this->currentState = Attribute;
  QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
            ((QMovableArrayOps<QString> *)&this->tagStack,
             (this->tagStack).super_QList<QString>.d.size,tag);
  QList<QString>::end(&(this->tagStack).super_QList<QString>);
  this->currentLevel = this->currentLevel + 1;
  updateIndent(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void XmlOutput::newTagOpen(const QString &tag)
{
    Q_ASSERT_X(tag.size(), "XmlOutput", "Cannot open an empty tag");
    closeOpen();

    if (format == NewLine)
        xmlFile << Qt::endl << currentIndent;
    xmlFile << '<' << doConversion(tag);
    currentState = Attribute;
    tagStack.append(tag);
    increaseIndent(); // ---> indent
}